

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screrror.cpp
# Opt level: O1

void CopyException(EXCEPINFO *peiDest,EXCEPINFO *peiSource)

{
  BSTR pWVar1;
  BSTR pWVar2;
  PVOID pvVar3;
  SCODE SVar4;
  undefined4 uVar5;
  DWORD DVar6;
  undefined4 uVar7;
  WORD WVar8;
  WORD WVar9;
  undefined4 uVar10;
  UINT UVar11;
  BSTR pWVar12;
  
  if (peiDest->bstrSource != (BSTR)0x0) {
    SysFreeString(peiDest->bstrSource);
  }
  if (peiDest->bstrDescription != (BSTR)0x0) {
    SysFreeString(peiDest->bstrDescription);
  }
  if (peiDest->bstrHelpFile != (BSTR)0x0) {
    SysFreeString(peiDest->bstrHelpFile);
  }
  peiDest->pfnDeferredFillIn = (_func_HRESULT_tagEXCEPINFO_ptr *)0x0;
  *(undefined8 *)&peiDest->scode = 0;
  *(undefined8 *)&peiDest->dwHelpContext = 0;
  peiDest->pvReserved = (PVOID)0x0;
  peiDest->bstrDescription = (BSTR)0x0;
  peiDest->bstrHelpFile = (BSTR)0x0;
  peiDest->wCode = 0;
  peiDest->wReserved = 0;
  *(undefined4 *)&peiDest->field_0x4 = 0;
  peiDest->bstrSource = (BSTR)0x0;
  WVar8 = peiSource->wCode;
  WVar9 = peiSource->wReserved;
  uVar10 = *(undefined4 *)&peiSource->field_0x4;
  pWVar12 = peiSource->bstrSource;
  pWVar1 = peiSource->bstrDescription;
  pWVar2 = peiSource->bstrHelpFile;
  DVar6 = peiSource->dwHelpContext;
  uVar7 = *(undefined4 *)&peiSource->field_0x24;
  pvVar3 = peiSource->pvReserved;
  SVar4 = peiSource->scode;
  uVar5 = *(undefined4 *)&peiSource->field_0x3c;
  peiDest->pfnDeferredFillIn = peiSource->pfnDeferredFillIn;
  peiDest->scode = SVar4;
  *(undefined4 *)&peiDest->field_0x3c = uVar5;
  peiDest->dwHelpContext = DVar6;
  *(undefined4 *)&peiDest->field_0x24 = uVar7;
  peiDest->pvReserved = pvVar3;
  peiDest->bstrDescription = pWVar1;
  peiDest->bstrHelpFile = pWVar2;
  peiDest->wCode = WVar8;
  peiDest->wReserved = WVar9;
  *(undefined4 *)&peiDest->field_0x4 = uVar10;
  peiDest->bstrSource = pWVar12;
  pWVar12 = peiSource->bstrSource;
  if (pWVar12 != (BSTR)0x0) {
    UVar11 = SysStringLen(pWVar12);
    pWVar12 = SysAllocStringLen(pWVar12,UVar11);
    peiDest->bstrSource = pWVar12;
  }
  pWVar12 = peiSource->bstrDescription;
  if (pWVar12 != (BSTR)0x0) {
    UVar11 = SysStringLen(pWVar12);
    pWVar12 = SysAllocStringLen(pWVar12,UVar11);
    peiDest->bstrDescription = pWVar12;
  }
  pWVar12 = peiSource->bstrHelpFile;
  if (pWVar12 != (BSTR)0x0) {
    UVar11 = SysStringLen(pWVar12);
    pWVar12 = SysAllocStringLen(pWVar12,UVar11);
    peiDest->bstrHelpFile = pWVar12;
  }
  return;
}

Assistant:

void CopyException (EXCEPINFO *peiDest, const EXCEPINFO *peiSource)
{
    FreeExcepInfo(peiDest);
    *peiDest = *peiSource;
    if (peiSource->bstrSource) {
        peiDest->bstrSource =
            SysAllocStringLen(peiSource->bstrSource, SysStringLen(peiSource->bstrSource));
    }
    if (peiSource->bstrDescription) {
        peiDest->bstrDescription =
            SysAllocStringLen(peiSource->bstrDescription, SysStringLen(peiSource->bstrDescription));
    }
    if (peiSource->bstrHelpFile) {
        peiDest->bstrHelpFile =
            SysAllocStringLen(peiSource->bstrHelpFile, SysStringLen(peiSource->bstrHelpFile));
    }
}